

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::(anonymous_namespace)::DynamicMessageTest_Extensions_Test::
~DynamicMessageTest_Extensions_Test(DynamicMessageTest_Extensions_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__DynamicMessageTest_018eb948;
  *(undefined ***)this = &PTR__DynamicMessageTest_018eb988;
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)(this + 0x80));
  DescriptorPool::~DescriptorPool((DescriptorPool *)(this + 8));
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x130);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Extensions) {
  // Check that extensions work.
  Arena arena;
  Message* message = extensions_prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(extensions_descriptor_);

  reflection_tester.SetAllFieldsViaReflection(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}